

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

void lws_context_destroy2(lws_context *context)

{
  lws_role_ops *plVar1;
  _func_void_lws_context_ptr_int *p_Var2;
  allocated_headers *ah;
  lws_vhost *plVar3;
  _func_int_lws_context_ptr *p_Var4;
  lws_vhost *vh;
  lws_role_ops **pplVar5;
  int iVar6;
  long lVar7;
  lws_context_per_thread *pt;
  
  _lws_log(8,"%s: ctx %p\n","lws_context_destroy2");
  context->field_0x510 = context->field_0x510 | 0x10;
  if (0 < context->count_threads) {
    lVar7 = 0;
    do {
      pt = context->pt + lVar7;
      lws_seq_destroy_all_on_pt(pt);
      plVar1 = available_roles[0];
      pplVar5 = available_roles;
      while (pplVar5 = pplVar5 + 1, plVar1 != (lws_role_ops *)0x0) {
        if (plVar1->pt_init_destroy !=
            (_func_int_lws_context_ptr_lws_context_creation_info_ptr_lws_context_per_thread_ptr_int
             *)0x0) {
          (*plVar1->pt_init_destroy)(context,(lws_context_creation_info *)0x0,pt,1);
        }
        plVar1 = *pplVar5;
      }
      p_Var2 = context->event_loop_ops->destroy_pt;
      if (p_Var2 != (_func_void_lws_context_ptr_int *)0x0) {
        (*p_Var2)(context,(int)lVar7);
      }
      while (ah = (pt->http).ah_list, ah != (allocated_headers *)0x0) {
        _lws_destroy_ah(pt,ah);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < context->count_threads);
  }
  vh = context->vhost_list;
  while (vh != (lws_vhost *)0x0) {
    plVar3 = vh->vhost_next;
    __lws_vhost_destroy2(vh);
    vh = plVar3;
  }
  _lws_log(0x10,"%p: post vh listl\n","lws_context_destroy2");
  while (context->vhost_pending_destruction_list != (lws_vhost *)0x0) {
    __lws_vhost_destroy2(context->vhost_pending_destruction_list);
  }
  _lws_log(0x10,"%p: post pdl\n","lws_context_destroy2");
  lws_ssl_context_destroy(context);
  lws_plat_context_late_destroy(context);
  _lws_log(0x10,"%p: baggage\n","lws_context_destroy2");
  if (context->external_baggage_free_on_destroy != (void *)0x0) {
    free(context->external_baggage_free_on_destroy);
  }
  lws_check_deferred_free(context,0,1);
  p_Var4 = context->event_loop_ops->destroy_context2;
  if ((p_Var4 != (_func_int_lws_context_ptr *)0x0) && (iVar6 = (*p_Var4)(context), iVar6 != 0)) {
    context->field_0x511 = context->field_0x511 | 2;
    return;
  }
  _lws_log(0x10,"%p: post dc2\n","lws_context_destroy2");
  if (((context->pt[0].field_0x187 & 4) == 0) && (0 < (long)context->count_threads)) {
    lVar7 = 0;
    do {
      if ((*(byte *)((long)(context->set).s + lVar7 + -0x41) & 1) != 0) {
        _lws_log(0x10,"%p: bailing as inside service\n","lws_context_destroy2");
        return;
      }
      lVar7 = lVar7 + 0x188;
    } while ((long)context->count_threads * 0x188 - lVar7 != 0);
  }
  lws_context_destroy3(context);
  return;
}

Assistant:

void
lws_context_destroy2(struct lws_context *context)
{
#if defined(LWS_WITH_NETWORK)
	struct lws_vhost *vh = NULL, *vh1;
	int n;
#endif
#if defined(LWS_WITH_PEER_LIMITS)
	uint32_t nu;
#endif

	lwsl_info("%s: ctx %p\n", __func__, context);

	lws_context_lock(context, "context destroy 2"); /* ------ context { */

	context->being_destroyed2 = 1;
#if defined(LWS_WITH_NETWORK)

	/*
	 * We're going to trash things like vhost-protocols
	 * So we need to finish dealing with wsi close that
	 * might make callbacks first
	 */
	for (n = 0; n < context->count_threads; n++) {
		struct lws_context_per_thread *pt = &context->pt[n];

		(void)pt;

#if defined(LWS_WITH_SECURE_STREAMS)
		lws_dll2_foreach_safe(&pt->ss_owner, NULL, lws_ss_destroy_dll);
		if (context->ac_policy)
			lwsac_free(&context->ac_policy);
#endif

#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API)
		lws_dll2_foreach_safe(&pt->ss_client_owner, NULL, lws_sspc_destroy_dll);
#endif

#if defined(LWS_WITH_SEQUENCER)
		lws_seq_destroy_all_on_pt(pt);
#endif
		LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar) {
			if (ar->pt_init_destroy)
				ar->pt_init_destroy(context, NULL, pt, 1);
		} LWS_FOR_EVERY_AVAILABLE_ROLE_END;

#if defined(LWS_WITH_CGI)
		role_ops_cgi.pt_init_destroy(context, NULL, pt, 1);
#endif

		if (context->event_loop_ops->destroy_pt)
			context->event_loop_ops->destroy_pt(context, n);

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		while (pt->http.ah_list)
			_lws_destroy_ah(pt, pt->http.ah_list);
#endif
	}

	/*
	 * free all the per-vhost allocations
	 */

	vh = context->vhost_list;
	while (vh) {
		vh1 = vh->vhost_next;
		__lws_vhost_destroy2(vh);
		vh = vh1;
	}

	lwsl_debug("%p: post vh listl\n", __func__);

	/* remove ourselves from the pending destruction list */

	while (context->vhost_pending_destruction_list)
		/* removes itself from list */
		__lws_vhost_destroy2(context->vhost_pending_destruction_list);
#endif

	lwsl_debug("%p: post pdl\n", __func__);

	lws_stats_log_dump(context);
#if defined(LWS_WITH_NETWORK)
	lws_ssl_context_destroy(context);
#endif
	lws_plat_context_late_destroy(context);

#if defined(LWS_WITH_PEER_LIMITS)
	for (nu = 0; nu < context->pl_hash_elements; nu++)	{
		lws_start_foreach_llp(struct lws_peer **, peer,
				      context->pl_hash_table[nu]) {
			struct lws_peer *df = *peer;
			*peer = df->next;
			lws_free(df);
			continue;
		} lws_end_foreach_llp(peer, next);
	}
	lws_free(context->pl_hash_table);
#endif

	lwsl_debug("%p: baggage\n", __func__);

	if (context->external_baggage_free_on_destroy)
		free(context->external_baggage_free_on_destroy);

#if defined(LWS_WITH_NETWORK)
	lws_check_deferred_free(context, 0, 1);
#endif


#if LWS_MAX_SMP > 1
	lws_mutex_refcount_destroy(&context->mr);
#endif
#if defined(LWS_WITH_NETWORK)
	if (context->event_loop_ops->destroy_context2)
		if (context->event_loop_ops->destroy_context2(context)) {
			lws_context_unlock(context); /* } context ----------- */
			context->finalize_destroy_after_internal_loops_stopped = 1;
			return;
		}

	lwsl_debug("%p: post dc2\n", __func__);

	if (!context->pt[0].event_loop_foreign) {
		int n;
		for (n = 0; n < context->count_threads; n++)
			if (context->pt[n].inside_service) {
				lwsl_debug("%p: bailing as inside service\n", __func__);
				lws_context_unlock(context); /* } context --- */
				return;
			}
	}
#endif
	lws_context_unlock(context); /* } context ------------------- */

	lws_context_destroy3(context);
}